

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::BaseAtomVisitor::setVisited(BaseAtomVisitor *this,Atom *atom)

{
  GenericData *pGVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  GenericData *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [24];
  undefined1 auStack_40 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_68 = (GenericData *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"VISITED","");
  StuntDouble::getPropertyByName((StuntDouble *)(local_58 + 0x10),(string *)atom);
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_40._0_8_;
  uVar3 = local_58._16_8_;
  auStack_40._0_8_ = 0;
  local_58._16_8_ = 0;
  if (local_68 != (GenericData *)local_58) {
    operator_delete(local_68,local_58._0_8_ + 1);
  }
  if (uVar3 == 0) {
    local_68 = (GenericData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::GenericData,std::allocator<OpenMD::GenericData>>
              (&_Stack_60,&local_68,(allocator<OpenMD::GenericData> *)(local_58 + 0x10));
    _Var2._M_pi = _Stack_60._M_pi;
    pGVar1 = local_68;
    local_68 = (GenericData *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
    local_68 = (GenericData *)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"VISITED","");
    std::__cxx11::string::_M_assign((string *)&pGVar1->id_);
    if (local_68 != (GenericData *)local_58) {
      operator_delete(local_68,local_58._0_8_ + 1);
    }
    auStack_40._8_8_ = pGVar1;
    local_30 = _Var2._M_pi;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      }
    }
    StuntDouble::addProperty
              (&atom->super_StuntDouble,(shared_ptr<OpenMD::GenericData> *)(auStack_40 + 8));
    this_00._M_pi = _Var2._M_pi;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void BaseAtomVisitor::setVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");

    // if visited property is not existed, add it as new property
    if (data == nullptr) {
      data = std::make_shared<GenericData>();
      data->setID("VISITED");
      atom->addProperty(data);
    }
  }